

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

string * disp::to_string<double>(double v)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double in_XMM0_Qa;
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_1d8 [32];
  string local_1b8 [48];
  ostringstream local_188 [376];
  double local_10;
  
  __lhs = in_RDI;
  local_10 = in_XMM0_Qa;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::ostream::operator<<(local_188,local_10);
  std::__cxx11::ostringstream::str();
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return __lhs;
}

Assistant:

static std::string to_string(T v)
	{
		std::ostringstream ss;
		ss<<v;
		return "to_str(" + ss.str() + ")";
	}